

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backoff.c
# Opt level: O2

void nn_backoff_start(nn_backoff *self)

{
  int iVar1;
  int timeout;
  
  iVar1 = self->maxivl;
  timeout = (self->n + -1) * self->minivl;
  if (timeout <= iVar1) {
    self->n = self->n * 2;
    nn_timer_start(&self->timer,timeout);
    return;
  }
  if (-1 < iVar1) {
    (self->timer).timeout = iVar1;
    nn_fsm_start((nn_fsm *)self);
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","timeout >= 0",
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/aio/timer.c"
          ,0x4f);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_backoff_start (struct nn_backoff *self)
{
     int timeout;

     /*  Start the timer for the actual n value. If the interval haven't yet
         exceeded the maximum, double the next timeout value. */
     timeout = (self->n - 1) * self->minivl;
     if (timeout > self->maxivl)
         timeout = self->maxivl;
     else
         self->n *= 2;
     nn_timer_start (&self->timer, timeout);
}